

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::AtomicDeclarationTest<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (AtomicDeclarationTest<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  TestError *pTVar4;
  ulong *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  ulong uVar11;
  undefined1 *puVar12;
  bool bVar13;
  string *local_1c8;
  GLint max_atomics;
  string invalid_shader_source;
  string valid_shader_source;
  string invalid_iteration;
  string indent;
  char it [16];
  string valid_iteration;
  string indexing;
  string comment;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensions;
  string loop_end;
  char max [16];
  string valid_definition;
  string invalid_definition;
  
  uVar2 = (ulong)tested_shader_type;
  iVar3 = (*((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id)->
            m_renderCtx->_vptr_RenderContext[3])();
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  comment._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  indent._M_string_length = 0;
  indent.field_2._M_local_buf[0] = '\0';
  indexing._M_dataplus._M_p = (pointer)&indexing.field_2;
  indexing._M_string_length = 0;
  indexing.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalid_definition,test_shader_compilation::uniform_atomic_uint,
             (allocator<char> *)&invalid_iteration);
  invalid_iteration._M_dataplus._M_p = (pointer)&invalid_iteration.field_2;
  invalid_iteration._M_string_length = 0;
  invalid_iteration.field_2._M_local_buf[0] = '\0';
  invalid_shader_source._M_dataplus._M_p = (pointer)&invalid_shader_source.field_2;
  invalid_shader_source._M_string_length = 0;
  invalid_shader_source.field_2._M_local_buf[0] = '\0';
  loop_end._M_dataplus._M_p = (pointer)&loop_end.field_2;
  loop_end._M_string_length = 0;
  loop_end.field_2._M_local_buf[0] = '\0';
  max_atomics = 0;
  valid_shader_source._M_string_length = 0;
  valid_shader_source.field_2._M_local_buf[0] = '\0';
  valid_shader_source._M_dataplus._M_p = (pointer)&valid_shader_source.field_2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&valid_definition,test_shader_compilation::uniform_atomic_uint,
             (allocator<char> *)&valid_iteration);
  paVar1 = &valid_iteration.field_2;
  valid_iteration._M_string_length = 0;
  valid_iteration.field_2._M_local_buf[0] = '\0';
  valid_iteration._M_dataplus._M_p = (pointer)paVar1;
  if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1fcd);
    goto LAB_00b71ee1;
  }
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x868))
            (*(undefined4 *)(&DAT_01b0efa0 + uVar2 * 4),&max_atomics);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x1fd3);
  if (max_atomics == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)valid_iteration._M_dataplus._M_p != paVar1) {
      operator_delete(valid_iteration._M_dataplus._M_p,
                      CONCAT71(valid_iteration.field_2._M_allocated_capacity._1_7_,
                               valid_iteration.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)valid_definition._M_dataplus._M_p != &valid_definition.field_2) {
      operator_delete(valid_definition._M_dataplus._M_p,
                      valid_definition.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)valid_shader_source._M_dataplus._M_p != &valid_shader_source.field_2) {
      operator_delete(valid_shader_source._M_dataplus._M_p,
                      CONCAT71(valid_shader_source.field_2._M_allocated_capacity._1_7_,
                               valid_shader_source.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)loop_end._M_dataplus._M_p != &loop_end.field_2) {
      operator_delete(loop_end._M_dataplus._M_p,
                      CONCAT71(loop_end.field_2._M_allocated_capacity._1_7_,
                               loop_end.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)invalid_shader_source._M_dataplus._M_p != &invalid_shader_source.field_2) {
      operator_delete(invalid_shader_source._M_dataplus._M_p,
                      CONCAT71(invalid_shader_source.field_2._M_allocated_capacity._1_7_,
                               invalid_shader_source.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)invalid_iteration._M_dataplus._M_p != &invalid_iteration.field_2) {
      operator_delete(invalid_iteration._M_dataplus._M_p,
                      CONCAT71(invalid_iteration.field_2._M_allocated_capacity._1_7_,
                               invalid_iteration.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)invalid_definition._M_dataplus._M_p != &invalid_definition.field_2) {
      operator_delete(invalid_definition._M_dataplus._M_p,
                      invalid_definition.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)indexing._M_dataplus._M_p != &indexing.field_2) {
      operator_delete(indexing._M_dataplus._M_p,
                      CONCAT71(indexing.field_2._M_allocated_capacity._1_7_,
                               indexing.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)indent._M_dataplus._M_p != &indent.field_2) {
      operator_delete(indent._M_dataplus._M_p,
                      CONCAT71(indent.field_2._M_allocated_capacity._1_7_,
                               indent.field_2._M_local_buf[0]) + 1);
    }
    if (dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)dimensions.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)dimensions.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment._M_dataplus._M_p != &comment.field_2) {
      operator_delete(comment._M_dataplus._M_p,
                      CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                               comment.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&dimensions,8);
  prepareDimensions<glcts::ArraysOfArrays::Interface::GL>((long)max_atomics,&dimensions);
  local_1c8 = (string *)0x7;
  uVar11 = 0;
  do {
    std::__cxx11::string::append((char *)&indent);
    std::__cxx11::string::insert((ulong)&loop_end,(char *)0x0);
    std::__cxx11::string::replace((ulong)&loop_end,0,(char *)0x0,(ulong)indent._M_dataplus._M_p);
    sprintf(it,"i%u",uVar11);
    std::__cxx11::string::append((char *)&indexing);
    std::__cxx11::string::append((char *)&indexing);
    std::__cxx11::string::append((char *)&indexing);
    sprintf(max,"%u",(ulong)(uint)dimensions.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start[(long)local_1c8]);
    std::__cxx11::string::append((char *)&valid_definition);
    std::__cxx11::string::append((char *)&valid_definition);
    std::__cxx11::string::append((char *)&valid_definition);
    std::__cxx11::string::_M_append((char *)&valid_iteration,(ulong)indent._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::_M_append((char *)&valid_iteration,(ulong)indent._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&valid_iteration);
    bVar13 = local_1c8 == (string *)0x0;
    local_1c8 = (string *)((long)local_1c8 + -1);
    if (bVar13) {
      sprintf(max,"%u",(ulong)((int)*dimensions.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::__cxx11::string::append((char *)&invalid_definition);
    std::__cxx11::string::append((char *)&invalid_definition);
    std::__cxx11::string::append((char *)&invalid_definition);
    std::__cxx11::string::_M_append((char *)&invalid_iteration,(ulong)indent._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::_M_append((char *)&invalid_iteration,(ulong)indent._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&invalid_iteration);
    uVar11 = (ulong)((int)uVar11 + 1);
  } while (local_1c8 != (string *)0xffffffffffffffff);
  sprintf(it,"%u",(ulong)(uint)max_atomics);
  std::__cxx11::string::append((char *)&comment);
  std::__cxx11::string::append((char *)&comment);
  std::__cxx11::string::append((char *)&comment);
  std::__cxx11::string::_M_append((char *)&invalid_shader_source,(ulong)comment._M_dataplus._M_p);
  std::__cxx11::string::_M_append
            ((char *)&invalid_shader_source,(ulong)invalid_definition._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&invalid_shader_source);
  std::__cxx11::string::_M_append
            ((char *)&invalid_shader_source,(ulong)invalid_iteration._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)&invalid_shader_source,(ulong)indent._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&invalid_shader_source);
  std::__cxx11::string::append((char *)&invalid_shader_source);
  std::__cxx11::string::_M_append((char *)&invalid_shader_source,(ulong)indexing._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&invalid_shader_source);
  std::__cxx11::string::_M_append((char *)&invalid_shader_source,(ulong)loop_end._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)comment._M_dataplus._M_p);
  std::__cxx11::string::_M_append
            ((char *)&valid_shader_source,(ulong)valid_definition._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::_M_append
            ((char *)&valid_shader_source,(ulong)valid_iteration._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)indent._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)indexing._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)loop_end._M_dataplus._M_p);
  switch(uVar2) {
  case 0:
  case 2:
  case 5:
    break;
  case 1:
    std::__cxx11::string::append((char *)&invalid_shader_source);
    break;
  case 3:
    puVar5 = &emit_quad_abi_cxx11_;
    goto LAB_00b72520;
  case 4:
    puVar5 = &set_tesseation_abi_cxx11_;
LAB_00b72520:
    std::__cxx11::string::_M_append((char *)&invalid_shader_source,*puVar5);
    break;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x203c);
    goto LAB_00b71ee1;
  }
  local_1c8 = &invalid_shader_source;
  std::__cxx11::string::_M_append((char *)local_1c8,shader_end_abi_cxx11_);
  switch(uVar2) {
  case 0:
  case 2:
  case 5:
    break;
  case 1:
    std::__cxx11::string::append((char *)&valid_shader_source);
    break;
  case 3:
    puVar5 = &emit_quad_abi_cxx11_;
    goto LAB_00b72576;
  case 4:
    puVar5 = &set_tesseation_abi_cxx11_;
LAB_00b72576:
    std::__cxx11::string::_M_append((char *)&valid_shader_source,*puVar5);
    break;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x203d);
LAB_00b71ee1:
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  puVar12 = (undefined1 *)&valid_shader_source;
  std::__cxx11::string::_M_append(puVar12,shader_end_abi_cxx11_);
  puVar10 = default_fragment_shader_source_abi_cxx11_;
  puVar9 = default_geometry_shader_source_abi_cxx11_;
  puVar8 = default_vertex_shader_source_abi_cxx11_;
  puVar6 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
  puVar7 = default_tc_shader_source_abi_cxx11_;
  switch(uVar2) {
  case 0:
    puVar10 = (undefined1 *)&valid_shader_source;
    break;
  case 1:
    puVar8 = (undefined1 *)&valid_shader_source;
    break;
  case 2:
    puVar8 = empty_string_abi_cxx11_;
    puVar7 = empty_string_abi_cxx11_;
    puVar6 = empty_string_abi_cxx11_;
    puVar9 = empty_string_abi_cxx11_;
    puVar10 = empty_string_abi_cxx11_;
    goto LAB_00b7265d;
  case 3:
    puVar9 = (undefined1 *)&valid_shader_source;
    break;
  case 4:
    puVar7 = (undefined1 *)&valid_shader_source;
    break;
  case 5:
    puVar6 = (undefined1 *)&valid_shader_source;
    break;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x2040);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  puVar12 = empty_string_abi_cxx11_;
LAB_00b7265d:
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[10])(this,puVar8,puVar7,puVar6,puVar9,puVar10,puVar12,1,0);
  switch(uVar2) {
  case 0:
    puVar12 = (undefined1 *)&invalid_shader_source;
    puVar10 = default_geometry_shader_source_abi_cxx11_;
    break;
  case 1:
    puVar12 = default_fragment_shader_source_abi_cxx11_;
    puVar10 = default_geometry_shader_source_abi_cxx11_;
    puVar8 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
    puVar9 = default_tc_shader_source_abi_cxx11_;
    puVar7 = (undefined1 *)&invalid_shader_source;
    goto LAB_00b7276d;
  case 2:
    puVar7 = empty_string_abi_cxx11_;
    puVar9 = empty_string_abi_cxx11_;
    puVar8 = empty_string_abi_cxx11_;
    puVar10 = empty_string_abi_cxx11_;
    puVar12 = empty_string_abi_cxx11_;
    goto LAB_00b72778;
  case 3:
    puVar12 = default_fragment_shader_source_abi_cxx11_;
    puVar10 = (undefined1 *)&invalid_shader_source;
    break;
  case 4:
    puVar12 = default_fragment_shader_source_abi_cxx11_;
    puVar10 = default_geometry_shader_source_abi_cxx11_;
    puVar8 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
    puVar9 = (undefined1 *)&invalid_shader_source;
    goto LAB_00b72766;
  case 5:
    puVar12 = default_fragment_shader_source_abi_cxx11_;
    puVar10 = default_geometry_shader_source_abi_cxx11_;
    puVar8 = (undefined1 *)&invalid_shader_source;
    goto LAB_00b7275f;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x2048);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  puVar8 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
LAB_00b7275f:
  puVar9 = default_tc_shader_source_abi_cxx11_;
LAB_00b72766:
  puVar7 = default_vertex_shader_source_abi_cxx11_;
LAB_00b7276d:
  local_1c8 = (string *)empty_string_abi_cxx11_;
LAB_00b72778:
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[10])(this,puVar7,puVar9,puVar8,puVar10,puVar12,local_1c8,1,0);
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"It was expected that build process will fail",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x2051);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void AtomicDeclarationTest<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const char* indent_step		   = "    ";
	static const char* uniform_atomic_uint = "layout(binding = 0) uniform atomic_uint";

	const glw::Functions& gl = this->context_id.getRenderContext().getFunctions();

	std::string			comment;
	std::vector<size_t> dimensions;
	std::string			indent;
	std::string			indexing;
	std::string			invalid_definition = uniform_atomic_uint;
	std::string			invalid_iteration;
	std::string			invalid_shader_source;
	std::string			loop_end;
	glw::GLint			max_atomics = 0;
	glw::GLenum			pname		= 0;
	std::string			valid_shader_source;
	std::string			valid_definition = uniform_atomic_uint;
	std::string			valid_iteration;

	/* Select pname of max for stage */
	switch (tested_shader_type)
	{
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		pname = GL_MAX_COMPUTE_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		pname = GL_MAX_FRAGMENT_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		pname = GL_MAX_GEOMETRY_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
		pname = GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		pname = GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		pname = GL_MAX_VERTEX_ATOMIC_COUNTERS;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Get maximum */
	gl.getIntegerv(pname, &max_atomics);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	if (0 == max_atomics)
	{
		/* Not supported - skip */
		return;
	}
	else
	{
		dimensions.resize(API::MAX_ARRAY_DIMENSIONS);
		prepareDimensions<API>(max_atomics, dimensions);
	}

	/* Prepare parts of shader */
	for (size_t i = API::MAX_ARRAY_DIMENSIONS; i != 0; --i)
	{
		char it[16];
		char max[16];

		indent += indent_step;

		loop_end.insert(0, "}\n");
		loop_end.insert(0, indent);

		sprintf(it, "i%u", (unsigned int)(API::MAX_ARRAY_DIMENSIONS - i));

		indexing += "[";
		indexing += it;
		indexing += "]";

		sprintf(max, "%u", (unsigned int)(dimensions[i - 1]));

		valid_definition += "[";
		valid_definition += max;
		valid_definition += "]";

		valid_iteration += indent;
		valid_iteration += "for (uint ";
		valid_iteration += it;
		valid_iteration += " = 0; ";
		valid_iteration += it;
		valid_iteration += " < ";
		valid_iteration += max;
		valid_iteration += "; ++";
		valid_iteration += it;
		valid_iteration += ")\n";
		valid_iteration += indent;
		valid_iteration += "{\n";

		if (1 == i)
		{
			sprintf(max, "%u", (unsigned int)(dimensions[i - 1] + 1));
		}
		invalid_definition += "[";
		invalid_definition += max;
		invalid_definition += "]";

		invalid_iteration += indent;
		invalid_iteration += "for (uint ";
		invalid_iteration += it;
		invalid_iteration += " = 0; ";
		invalid_iteration += it;
		invalid_iteration += " < ";
		invalid_iteration += max;
		invalid_iteration += "; ++";
		invalid_iteration += it;
		invalid_iteration += ")\n";
		invalid_iteration += indent;
		invalid_iteration += "{\n";
	}

	{
		char max[16];

		sprintf(max, "%u", (unsigned int)(max_atomics));
		comment += "/* MAX_*_ATOMIC_COUNTERS = ";
		comment += max;
		comment += " */\n";
	}

	/* Prepare invalid source */
	invalid_shader_source += comment;
	invalid_shader_source += invalid_definition;
	invalid_shader_source += " a;\n\nvoid main()\n{\n";
	invalid_shader_source += invalid_iteration;
	invalid_shader_source += indent;
	invalid_shader_source += indent_step;
	invalid_shader_source += "atomicCounterIncrement( a";
	invalid_shader_source += indexing;
	invalid_shader_source += " );\n";
	invalid_shader_source += loop_end;

	/* Prepare valid source */
	valid_shader_source += comment;
	valid_shader_source += valid_definition;
	valid_shader_source += " a;\n\nvoid main()\n{\n";
	valid_shader_source += valid_iteration;
	valid_shader_source += indent;
	valid_shader_source += indent_step;
	valid_shader_source += "atomicCounterIncrement( a";
	valid_shader_source += indexing;
	valid_shader_source += " );\n";
	valid_shader_source += loop_end;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, invalid_shader_source);
	DEFAULT_MAIN_ENDING(tested_shader_type, valid_shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, valid_shader_source, true, false);

	/* Expect build failure for invalid shader source */
	{
		bool negative_build_test_result = false;

		try
		{
			EXECUTE_POSITIVE_TEST(tested_shader_type, invalid_shader_source, true, false);
		}
		catch (...)
		{
			negative_build_test_result = true;
		}

		if (false == negative_build_test_result)
		{
			TCU_FAIL("It was expected that build process will fail");
		}
	}
}